

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O0

void Nf_ManComputeMappingEla(Nf_Man_t *p)

{
  Gia_Man_t *p_00;
  int iVar1;
  int f;
  int iVar2;
  Nf_Mat_t *pNVar3;
  int *piVar4;
  int *piVar5;
  Gia_Obj_t *pObj_00;
  bool bVar6;
  int Required;
  int *pCut;
  int k;
  int fCompl;
  int Id;
  int iVar;
  int c;
  int i;
  word Gain;
  word AreaAft;
  word AreaBef;
  Nf_Mat_t *pM;
  Nf_Mat_t *pMb;
  Nf_Mat_t Mb;
  Mio_Cell2_t *pCell;
  Gia_Obj_t *pObj;
  int fVerbose;
  Nf_Man_t *p_local;
  
  Nf_ManSetOutputRequireds(p,1);
  Nf_ManResetMatches(p,p->Iter - p->pPars->nRounds);
  iVar = p->pGia->nObjs;
  do {
    while( true ) {
      do {
        iVar = iVar + -1;
        bVar6 = false;
        if (0 < iVar) {
          pCell = (Mio_Cell2_t *)Gia_ManObj(p->pGia,iVar);
          bVar6 = pCell != (Mio_Cell2_t *)0x0;
        }
        if (!bVar6) {
          iVar = 0;
          while( true ) {
            iVar2 = Vec_IntSize(p->pGia->vCis);
            bVar6 = false;
            if (iVar < iVar2) {
              p_00 = p->pGia;
              pObj_00 = Gia_ManCi(p->pGia,iVar);
              k = Gia_ObjId(p_00,pObj_00);
              bVar6 = k != 0;
            }
            if (!bVar6) break;
            iVar2 = Nf_ObjMapRefNum(p,k,1);
            if (iVar2 != 0) {
              iVar2 = Nf_ObjRequired(p,iVar,1);
              Nf_ObjUpdateRequired(p,k,0,iVar2 - p->InvDelayI);
            }
            iVar = iVar + 1;
          }
          return;
        }
        iVar2 = Gia_ObjIsAnd((Gia_Obj_t *)pCell);
      } while (iVar2 == 0);
      iVar2 = Gia_ObjIsBuf((Gia_Obj_t *)pCell);
      if (iVar2 == 0) break;
      iVar2 = Nf_ObjMapRefNum(p,iVar,1);
      if (iVar2 != 0) {
        iVar2 = Nf_ObjRequired(p,iVar,1);
        Nf_ObjUpdateRequired(p,iVar,0,iVar2 - p->InvDelayI);
      }
      iVar2 = Gia_ObjFaninId0((Gia_Obj_t *)pCell,iVar);
      iVar1 = Gia_ObjFaninC0((Gia_Obj_t *)pCell);
      f = Nf_ObjRequired(p,iVar,0);
      Nf_ObjUpdateRequired(p,iVar2,iVar1,f);
    }
    for (Id = 0; Id < 2; Id = Id + 1) {
      iVar2 = Nf_ObjMapRefNum(p,iVar,Id);
      if (iVar2 != 0) {
        pNVar3 = Nf_ObjMatchBest(p,iVar,Id);
        iVar2 = Nf_ObjRequired(p,iVar,Id);
        if (iVar2 < pNVar3->D) {
          __assert_fail("pM->D <= Required",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaNf.c"
                        ,0x7b2,"void Nf_ManComputeMappingEla(Nf_Man_t *)");
        }
        if ((*(uint *)pNVar3 >> 0x1e & 1) == 0) {
          if ((*(uint *)pNVar3 >> 0x1e & 1) != 0) {
            __assert_fail("!pM->fCompl",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaNf.c"
                          ,0x7b6,"void Nf_ManComputeMappingEla(Nf_Man_t *)");
          }
          Nf_MatchDeref_rec(p,iVar,Id,pNVar3);
          if (-1 < *(int *)pNVar3) {
            __assert_fail("pM->fBest",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaNf.c"
                          ,0x7b8,"void Nf_ManComputeMappingEla(Nf_Man_t *)");
          }
          Nf_ManElaBestMatch(p,iVar,Id,(Nf_Mat_t *)&pMb,iVar2);
          Nf_MatchRef_rec(p,iVar,Id,(Nf_Mat_t *)&pMb,iVar2,(Vec_Int_t *)0x0);
          if (-1 < (int)(uint)pMb) {
            __assert_fail("pMb->fBest",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaNf.c"
                          ,0x7c9,"void Nf_ManComputeMappingEla(Nf_Man_t *)");
          }
          if (iVar2 < (int)Mb._0_4_) {
            __assert_fail("pMb->D <= Required",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaNf.c"
                          ,0x7ca,"void Nf_ManComputeMappingEla(Nf_Man_t *)");
          }
          *(ulong *)pNVar3 = CONCAT44(pMb._4_4_,(uint)pMb);
          pNVar3->D = Mb._0_4_;
          pNVar3->F = (float)Mb.Cfg;
          Mb._8_8_ = Nf_ManCell(p,(uint)pMb & 0xfffff);
          piVar4 = Nf_ObjCutSet(p,iVar);
          piVar4 = Nf_CutFromHandle(piVar4,(uint)pMb >> 0x14 & 0x3ff);
          pCut._0_4_ = 0;
          while( true ) {
            iVar1 = Nf_CutSize(piVar4);
            bVar6 = false;
            if ((int)pCut < iVar1) {
              piVar5 = Nf_CutLeaves(piVar4);
              iVar1 = Nf_CfgVar(pMb._4_4_,(int)pCut);
              fCompl = piVar5[iVar1];
              bVar6 = false;
              if (fCompl != 0) {
                pCut._4_4_ = Nf_CfgCompl(pMb._4_4_,(int)pCut);
                bVar6 = true;
              }
            }
            if (!bVar6) break;
            pNVar3 = Nf_ObjMatchBest(p,fCompl,pCut._4_4_);
            if (iVar2 - *(int *)(Mb._8_8_ + 0x2c + (long)(int)pCut * 4) < pNVar3->D) {
              __assert_fail("pM->D <= Required - pCell->iDelays[k]",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaNf.c"
                            ,0x7d4,"void Nf_ManComputeMappingEla(Nf_Man_t *)");
            }
            Nf_ObjUpdateRequired
                      (p,fCompl,pCut._4_4_,iVar2 - *(int *)(Mb._8_8_ + 0x2c + (long)(int)pCut * 4));
            if ((*(uint *)pNVar3 >> 0x1e & 1) != 0) {
              pNVar3 = Nf_ObjMatchBest(p,fCompl,(uint)((pCut._4_4_ != 0 ^ 0xffU) & 1));
              if ((iVar2 - *(int *)(Mb._8_8_ + 0x2c + (long)(int)pCut * 4)) - p->InvDelayI <
                  pNVar3->D) {
                __assert_fail("pM->D <= Required - pCell->iDelays[k] - p->InvDelayI",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaNf.c"
                              ,0x7d9,"void Nf_ManComputeMappingEla(Nf_Man_t *)");
              }
              Nf_ObjUpdateRequired
                        (p,fCompl,(uint)((pCut._4_4_ != 0 ^ 0xffU) & 1),
                         (iVar2 - *(int *)(Mb._8_8_ + 0x2c + (long)(int)pCut * 4)) - p->InvDelayI);
            }
            pCut._0_4_ = (int)pCut + 1;
          }
        }
      }
    }
  } while( true );
}

Assistant:

void Nf_ManComputeMappingEla( Nf_Man_t * p )
{
    int fVerbose = 0;
    Gia_Obj_t * pObj;
    Mio_Cell2_t * pCell;
    Nf_Mat_t Mb, * pMb = &Mb, * pM;
    word AreaBef, AreaAft, Gain = 0;
    int i, c, iVar, Id, fCompl, k, * pCut;
    int Required;
    Nf_ManSetOutputRequireds( p, 1 );
    Nf_ManResetMatches( p, p->Iter - p->pPars->nRounds );
    Gia_ManForEachAndReverse( p->pGia, pObj, i )
    {
        if ( Gia_ObjIsBuf(pObj) )
        {
            if ( Nf_ObjMapRefNum(p, i, 1) )
                Nf_ObjUpdateRequired( p, i, 0, Nf_ObjRequired(p, i, 1) - p->InvDelayI );
            Nf_ObjUpdateRequired( p, Gia_ObjFaninId0(pObj, i), Gia_ObjFaninC0(pObj), Nf_ObjRequired(p, i, 0) );
            continue;
        }
        for ( c = 0; c < 2; c++ )
        if ( Nf_ObjMapRefNum(p, i, c) )
        {
            pM = Nf_ObjMatchBest( p, i, c );
            Required = Nf_ObjRequired( p, i, c );
            assert( pM->D <= Required );
            if ( pM->fCompl )
                continue;
            // search for a better match
            assert( !pM->fCompl );
            AreaBef = Nf_MatchDeref_rec( p, i, c, pM );
            assert( pM->fBest );
            Nf_ManElaBestMatch( p, i, c, pMb, Required );
            AreaAft = Nf_MatchRef_rec( p, i, c, pMb, Required, NULL );
            Gain += AreaBef - AreaAft;
            // print area recover progress
            if ( fVerbose && Nf_ManCell(p, pM->Gate)->pName != Nf_ManCell(p, pMb->Gate)->pName )
            {
                printf( "%4d (%d)  ", i, c );
                printf( "%8s ->%8s  ",         Nf_ManCell(p, pM->Gate)->pName, Nf_ManCell(p, pMb->Gate)->pName );
                printf( "%d -> %d  ",          Nf_ManCell(p, pM->Gate)->nFanins, Nf_ManCell(p, pMb->Gate)->nFanins );
                printf( "D: %7.2f -> %7.2f  ", Scl_Int2Flt(pM->D), Scl_Int2Flt(pMb->D) );
                printf( "R: %7.2f  ",          Required == SCL_INFINITY ? 9999.99 : Scl_Int2Flt(Required) );
                printf( "A: %7.2f -> %7.2f  ", Scl_Int2Flt((int)AreaBef), Scl_Int2Flt((int)AreaAft) );
                printf( "G: %7.2f (%7.2f) ",   Scl_Int2Flt((int)AreaBef - (int)AreaAft), Scl_Int2Flt((int)Gain) );
                printf( "\n" );
            }
            // set best match
            assert( pMb->fBest );
            assert( pMb->D <= Required );
            //assert( Scl_Flt2Int(pMb->F) == (int)AreaAft );
            //assert( AreaBef >= AreaAft );
            *pM = *pMb;
            // update timing
            pCell = Nf_ManCell( p, pMb->Gate );
            pCut = Nf_CutFromHandle( Nf_ObjCutSet(p, i), pMb->CutH );
            Nf_CutForEachVarCompl( pCut, pMb->Cfg, iVar, fCompl, k )
            {
                pM = Nf_ObjMatchBest( p, iVar, fCompl );
                assert( pM->D <= Required - pCell->iDelays[k] );
                Nf_ObjUpdateRequired( p, iVar, fCompl, Required - pCell->iDelays[k] );
                if ( pM->fCompl )
                {
                    pM = Nf_ObjMatchBest( p, iVar, !fCompl );
                    assert( pM->D <= Required - pCell->iDelays[k] - p->InvDelayI );
                    Nf_ObjUpdateRequired( p, iVar, !fCompl, Required - pCell->iDelays[k] - p->InvDelayI );
                }
            }
        }
    }
    Gia_ManForEachCiId( p->pGia, Id, i )
        if ( Nf_ObjMapRefNum(p, Id, 1) )
        {
            Required = Nf_ObjRequired( p, i, 1 );
            Nf_ObjUpdateRequired( p, Id, 0, Required - p->InvDelayI );
        }
}